

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::inject_reduction_jobs(Group *this,View *view)

{
  bool bVar1;
  int iVar2;
  _Hash_node_base this_00;
  __node_base *p_Var3;
  float fVar4;
  uint8_t selector;
  const_iterator v;
  const_iterator end;
  uint8_t local_3d;
  float local_3c;
  _Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false> local_38;
  const_iterator local_30;
  
  local_3c = get_c_act(this);
  fVar4 = get_c_act_thr(this);
  if (fVar4 < local_3c) {
    local_38._M_cur = (__node_type *)(this->ipgm_views)._M_h._M_before_begin._M_nxt;
    local_30.
    super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>)
           (__node_type *)0x0;
    local_3d = '\0';
    while( true ) {
      bVar1 = views_with_inputs_cond(this,&local_3d,(const_iterator *)&local_38,&local_30);
      if (!bVar1) break;
      local_3c = View::get_act(*(View **)((long)&((local_38._M_cur)->
                                                 super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                                 ).
                                                 super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                                                 ._M_storage._M_storage + 8));
      fVar4 = get_act_thr(this);
      if (fVar4 < local_3c) {
        Controller::_take_input
                  (*(Controller **)
                    (*(long *)((long)&((local_38._M_cur)->
                                      super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                      ).
                                      super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                                      ._M_storage._M_storage + 8) + 0xb0),view);
      }
      local_38._M_cur = (__node_type *)((local_38._M_cur)->super__Hash_node_base)._M_nxt;
    }
  }
  p_Var3 = &(this->viewing_groups)._M_h._M_before_begin;
  while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
    if (*(char *)&((_Prime_rehash_policy *)(p_Var3 + 2))->_M_max_load_factor == '\0') {
      iVar2 = (*(view->super_View).super__Object._vptr__Object[2])(view);
      if ((char)iVar2 == '\0') {
        this_00._M_nxt = p_Var3[1]._M_nxt;
        local_38._M_cur = (__node_type *)this_00._M_nxt[0x4e]._M_nxt;
        local_30.
        super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
        _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                 )(__node_type *)0x0;
        local_3d = '\0';
        while( true ) {
          bVar1 = views_with_inputs_cond
                            ((Group *)this_00._M_nxt,&local_3d,(const_iterator *)&local_38,&local_30
                            );
          if (!bVar1) break;
          local_3c = View::get_act(*(View **)((long)&((local_38._M_cur)->
                                                                                                          
                                                  super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                                  ).
                                                  super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                                                  ._M_storage._M_storage + 8));
          fVar4 = get_act_thr((Group *)p_Var3[1]._M_nxt);
          if (fVar4 < local_3c) {
            Controller::_take_input
                      (*(Controller **)
                        (*(long *)((long)&((local_38._M_cur)->
                                          super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                          ).
                                          super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                                          ._M_storage._M_storage + 8) + 0xb0),view);
          }
          local_38._M_cur = (__node_type *)((local_38._M_cur)->super__Hash_node_base)._M_nxt;
          this_00._M_nxt = p_Var3[1]._M_nxt;
        }
      }
    }
  }
  return;
}

Assistant:

void Group::inject_reduction_jobs(View *view)
{
    if (get_c_act() > get_c_act_thr()) { // host is c-active.
        // build reduction jobs from host's own inputs and own overlays.
        FOR_ALL_VIEWS_WITH_INPUTS_BEGIN(this, v)

        if (v->second->get_act() > get_act_thr()) { //{ // active ipgm/icpp_pgm/rgrp view.
            v->second->controller->_take_input(view);    // view will be copied.
        }

        //std::cout<<std::hex<<(void *)v->second->controller<<std::dec<<" <- "<<view->object->get_oid()<<std::endl;}
        FOR_ALL_VIEWS_WITH_INPUTS_END
    }

    // build reduction jobs from host's own inputs and overlays from viewing groups, if no cov and view is not a notification.
    // NB: visibility is not transitive;
    // no shadowing: if a view alresady exists in the viewing group, there will be twice the reductions: all of the identicals will be trimmed down at injection time.
    std::unordered_map<Group *, bool>::const_iterator vg;

    for (vg = viewing_groups.begin(); vg != viewing_groups.end(); ++vg) {
        if (vg->second || view->isNotification()) { // no reduction jobs when cov==true or view is a notification.
            continue;
        }

        FOR_ALL_VIEWS_WITH_INPUTS_BEGIN(vg->first, v)

        if (v->second->get_act() > vg->first->get_act_thr()) { // active ipgm/icpp_pgm/rgrp view.
            v->second->controller->_take_input(view);    // view will be copied.
        }

        FOR_ALL_VIEWS_WITH_INPUTS_END
    }
}